

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_info.h
# Opt level: O3

string __thiscall BlockInfo::ToString(BlockInfo *this)

{
  _Alloc_hider _Var1;
  bool bVar2;
  _Alloc_hider _Var3;
  uint uVar4;
  uint uVar5;
  long *plVar6;
  undefined8 *puVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  long in_RSI;
  uint __len;
  string __str_1;
  string __str;
  long local_90;
  char *local_88 [2];
  undefined1 local_78 [8];
  char *local_70;
  string local_68;
  string local_60;
  string local_58;
  _Alloc_hider local_50;
  long local_48;
  long local_40;
  long local_38;
  
  uVar10 = *(ulong *)(in_RSI + 0x28);
  uVar11 = 1;
  if (9 < uVar10) {
    uVar9 = uVar10;
    uVar4 = 4;
    do {
      uVar11 = uVar4;
      if (uVar9 < 100) {
        uVar11 = uVar11 - 2;
        goto LAB_0011fa1c;
      }
      if (uVar9 < 1000) {
        uVar11 = uVar11 - 1;
        goto LAB_0011fa1c;
      }
      if (uVar9 < 10000) goto LAB_0011fa1c;
      bVar2 = 99999 < uVar9;
      uVar9 = uVar9 / 10000;
      uVar4 = uVar11 + 4;
    } while (bVar2);
    uVar11 = uVar11 + 1;
  }
LAB_0011fa1c:
  local_70 = (char *)std::string::_S_construct((ulong)uVar11,'\0',(allocator *)local_88);
  if (-1 < *(int *)(local_70 + -8)) {
    std::string::_M_leak_hard();
  }
  std::__detail::__to_chars_10_impl<unsigned_long_long>(local_70,*(uint *)(local_70 + -0x18),uVar10)
  ;
  plVar6 = (long *)std::string::insert((ulong)&local_70,(char *)0x0,0x127521);
  local_48 = *plVar6;
  *plVar6 = (long)std::string::insert;
  plVar6 = (long *)std::string::append((char *)&local_48,0x12802c);
  local_68._M_dataplus._M_p = (_Alloc_hider)*plVar6;
  *plVar6 = (long)std::string::insert;
  uVar10 = *(ulong *)(in_RSI + 0x30);
  uVar11 = 1;
  if (9 < uVar10) {
    uVar9 = uVar10;
    uVar4 = 4;
    do {
      uVar11 = uVar4;
      if (uVar9 < 100) {
        uVar11 = uVar11 - 2;
        goto LAB_0011fafe;
      }
      if (uVar9 < 1000) {
        uVar11 = uVar11 - 1;
        goto LAB_0011fafe;
      }
      if (uVar9 < 10000) goto LAB_0011fafe;
      bVar2 = 99999 < uVar9;
      uVar9 = uVar9 / 10000;
      uVar4 = uVar11 + 4;
    } while (bVar2);
    uVar11 = uVar11 + 1;
  }
LAB_0011fafe:
  local_88[0] = (char *)std::string::_S_construct((ulong)uVar11,'\0',(allocator *)&local_90);
  if (-1 < *(int *)(local_88[0] + -8)) {
    std::string::_M_leak_hard();
  }
  std::__detail::__to_chars_10_impl<unsigned_long_long>
            (local_88[0],*(uint *)(local_88[0] + -0x18),uVar10);
  uVar10 = *(long *)(local_88[0] + -0x18) + *(long *)((long)local_68._M_dataplus._M_p + -0x18);
  if ((*(ulong *)((long)local_68._M_dataplus._M_p + -0x10) < uVar10) &&
     (uVar10 <= *(ulong *)(local_88[0] + -0x10))) {
    plVar6 = (long *)std::string::insert((ulong)local_88,(string *)0x0,(ulong)&local_68,0);
  }
  else {
    plVar6 = (long *)std::string::append(&local_68);
  }
  local_40 = *plVar6;
  *plVar6 = (long)std::string::insert;
  local_50._M_p = (char *)this;
  plVar6 = (long *)std::string::append((char *)&local_40,0x12802c);
  local_60._M_dataplus._M_p = (_Alloc_hider)*plVar6;
  *plVar6 = (long)std::string::insert;
  uVar11 = *(uint *)(in_RSI + 0x38);
  uVar4 = -uVar11;
  if (0 < (int)uVar11) {
    uVar4 = uVar11;
  }
  __len = 1;
  if (9 < uVar4) {
    uVar10 = (ulong)uVar4;
    uVar5 = 4;
    do {
      __len = uVar5;
      uVar8 = (uint)uVar10;
      if (uVar8 < 100) {
        __len = __len - 2;
        goto LAB_0011fc0a;
      }
      if (uVar8 < 1000) {
        __len = __len - 1;
        goto LAB_0011fc0a;
      }
      if (uVar8 < 10000) goto LAB_0011fc0a;
      uVar10 = uVar10 / 10000;
      uVar5 = __len + 4;
    } while (99999 < uVar8);
    __len = __len + 1;
  }
LAB_0011fc0a:
  local_90 = std::string::_S_construct
                       ((ulong)(-((int)uVar11 >> 0x1f) + __len),'-',(allocator *)local_78);
  if (-1 < *(int *)(local_90 + -8)) {
    std::string::_M_leak_hard();
  }
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uint)-((int)uVar11 >> 0x1f) + local_90),__len,uVar4);
  uVar10 = *(long *)(local_90 + -0x18) + *(long *)((long)local_60._M_dataplus._M_p + -0x18);
  if ((*(ulong *)((long)local_60._M_dataplus._M_p + -0x10) < uVar10) &&
     (uVar10 <= *(ulong *)(local_90 + -0x10))) {
    plVar6 = (long *)std::string::insert((ulong)&local_90,(string *)0x0,(ulong)&local_60,0);
  }
  else {
    plVar6 = (long *)std::string::append(&local_60);
  }
  _Var3._M_p = local_50._M_p;
  local_38 = *plVar6;
  *plVar6 = (long)std::string::insert;
  plVar6 = (long *)std::string::append((char *)&local_38,0x12802d);
  _Var1._M_p = (char *)*plVar6;
  *plVar6 = (long)std::string::insert;
  local_58._M_dataplus._M_p = (_Alloc_hider)(_Alloc_hider)_Var1._M_p;
  DatanodeInfo::ToString((DatanodeInfo *)local_78);
  if ((*(_func_int **)(_Var1._M_p + -0x10) <
       *(_func_int **)((long)local_78 + -0x18) + *(long *)(_Var1._M_p + -0x18)) &&
     (*(_func_int **)((long)local_78 + -0x18) + *(long *)(_Var1._M_p + -0x18) <=
      *(_func_int **)((long)local_78 + -0x10))) {
    puVar7 = (undefined8 *)std::string::insert((ulong)local_78,(string *)0x0,(ulong)&local_58,0);
  }
  else {
    puVar7 = (undefined8 *)std::string::append(&local_58);
  }
  *(undefined8 *)_Var3._M_p = *puVar7;
  *puVar7 = std::string::insert;
  std::string::_Rep::_M_dispose((allocator *)((long)local_78 + -0x18));
  std::string::_Rep::_M_dispose((allocator *)((long)local_58._M_dataplus._M_p + -0x18));
  std::string::_Rep::_M_dispose((allocator *)(local_38 + -0x18));
  std::string::_Rep::_M_dispose((allocator *)(local_90 + -0x18));
  std::string::_Rep::_M_dispose((allocator *)((long)local_60._M_dataplus._M_p + -0x18));
  std::string::_Rep::_M_dispose((allocator *)(local_40 + -0x18));
  std::string::_Rep::_M_dispose((allocator *)(local_88[0] + -0x18));
  std::string::_Rep::_M_dispose((allocator *)((long)local_68._M_dataplus._M_p + -0x18));
  std::string::_Rep::_M_dispose((allocator *)(local_48 + -0x18));
  std::string::_Rep::_M_dispose((allocator *)(local_70 + -0x18));
  return (string)(_Alloc_hider)_Var3._M_p;
}

Assistant:

string ToString() const {
    return "BlockInfo:: " + to_string(lba_) + ", " + to_string(addr_) + ", " +
           to_string(length_) + " " + datanode_info_.ToString();
  }